

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

bool __thiscall
ViconCGStreamIO::VBuffer::Read<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>
          (VBuffer *this,
          vector<ViconCGStreamDetail::VCameraCalibrationHealth_Camera,_std::allocator<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>_>
          *o_rValues)

{
  bool bVar1;
  VCameraCalibrationHealth_Camera *local_38;
  uint local_24;
  vector<ViconCGStreamDetail::VCameraCalibrationHealth_Camera,_std::allocator<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>_>
  *pvStack_20;
  UInt32 Size;
  vector<ViconCGStreamDetail::VCameraCalibrationHealth_Camera,_std::allocator<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>_>
  *o_rValues_local;
  VBuffer *this_local;
  
  pvStack_20 = o_rValues;
  o_rValues_local =
       (vector<ViconCGStreamDetail::VCameraCalibrationHealth_Camera,_std::allocator<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>_>
        *)this;
  std::
  vector<ViconCGStreamDetail::VCameraCalibrationHealth_Camera,_std::allocator<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>_>
  ::clear(o_rValues);
  local_24 = 0;
  bVar1 = VBufferImpl::ReadPod<unsigned_int>(&this->m_BufferImpl,&local_24);
  if (bVar1) {
    std::
    vector<ViconCGStreamDetail::VCameraCalibrationHealth_Camera,_std::allocator<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>_>
    ::resize(pvStack_20,(ulong)local_24);
    bVar1 = std::
            vector<ViconCGStreamDetail::VCameraCalibrationHealth_Camera,_std::allocator<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>_>
            ::empty(pvStack_20);
    if (bVar1) {
      local_38 = (VCameraCalibrationHealth_Camera *)0x0;
    }
    else {
      local_38 = std::
                 vector<ViconCGStreamDetail::VCameraCalibrationHealth_Camera,_std::allocator<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>_>
                 ::operator[](pvStack_20,0);
    }
    this_local._7_1_ =
         VBufferDetail<0>::Read<ViconCGStreamDetail::VCameraCalibrationHealth_Camera>
                   (&this->m_BufferImpl,local_38,local_24);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Read( std::vector< T > & o_rValues ) const
  {
    o_rValues.clear();
    ViconCGStreamType::UInt32 Size = 0;
    if( !m_BufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    o_rValues.resize( Size );
    return VBufferDetail< VIsPod< T >::Answer >::Read( m_BufferImpl, o_rValues.empty() ? 0 : &o_rValues[ 0 ], Size );
  }